

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_lore_mimic(parser *p)

{
  wchar_t tval_00;
  wchar_t sval_00;
  void *pvVar1;
  char *pcVar2;
  object_kind *poVar3;
  undefined8 *puVar4;
  object_kind *kind;
  wchar_t sval;
  wchar_t tval;
  monster_mimic *m;
  monster_lore *l;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  else {
    pcVar2 = parser_getsym(p,"tval");
    tval_00 = tval_find_idx(pcVar2);
    if (tval_00 < L'\0') {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      pcVar2 = parser_getsym(p,"sval");
      sval_00 = lookup_sval(tval_00,pcVar2);
      if (sval_00 < L'\0') {
        p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_SVAL;
      }
      else {
        poVar3 = lookup_kind(tval_00,sval_00);
        if (poVar3 == (object_kind *)0x0) {
          p_local._4_4_ = PARSE_ERROR_NO_KIND_FOUND;
        }
        else {
          puVar4 = (undefined8 *)mem_zalloc(0x10);
          puVar4[1] = poVar3;
          *puVar4 = *(undefined8 *)((long)pvVar1 + 0x50);
          *(undefined8 **)((long)pvVar1 + 0x50) = puVar4;
          p_local._4_4_ = PARSE_ERROR_NONE;
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_lore_mimic(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	struct monster_mimic *m;
	int tval, sval;
	struct object_kind *kind;

	if (!l)
		return PARSE_ERROR_NONE;
	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	sval = lookup_sval(tval, parser_getsym(p, "sval"));
	if (sval < 0)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	kind = lookup_kind(tval, sval);
	if (!kind)
		return PARSE_ERROR_NO_KIND_FOUND;
	m = mem_zalloc(sizeof *m);
	m->kind = kind;
	m->next = l->mimic_kinds;
	l->mimic_kinds = m;
	return PARSE_ERROR_NONE;
}